

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O0

bool __thiscall
cmConditionEvaluator::GetBooleanValueOld
          (cmConditionEvaluator *this,cmExpandedCommandArgument *arg,bool one)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  char *local_38;
  char *def;
  char *def_1;
  bool one_local;
  cmExpandedCommandArgument *arg_local;
  cmConditionEvaluator *this_local;
  
  if (one) {
    bVar1 = cmExpandedCommandArgument::operator==(arg,"0");
    if (bVar1) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = cmExpandedCommandArgument::operator==(arg,"1");
      if (bVar1) {
        this_local._7_1_ = true;
      }
      else {
        pcVar3 = GetDefinitionIfUnquoted(this,arg);
        bVar1 = cmSystemTools::IsOff(pcVar3);
        this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
      }
    }
  }
  else {
    local_38 = GetDefinitionIfUnquoted(this,arg);
    if (local_38 == (char *)0x0) {
      pcVar3 = cmExpandedCommandArgument::c_str(arg);
      iVar2 = atoi(pcVar3);
      if (iVar2 != 0) {
        local_38 = cmExpandedCommandArgument::c_str(arg);
      }
    }
    bVar1 = cmSystemTools::IsOff(local_38);
    this_local._7_1_ = (bool)((bVar1 ^ 0xffU) & 1);
  }
  return this_local._7_1_;
}

Assistant:

bool cmConditionEvaluator::GetBooleanValueOld(
  cmExpandedCommandArgument const& arg, bool one) const
{
  if (one) {
    // Old IsTrue behavior for single argument.
    if (arg == "0") {
      return false;
    }
    if (arg == "1") {
      return true;
    }
    const char* def = this->GetDefinitionIfUnquoted(arg);
    return !cmSystemTools::IsOff(def);
  }
  // Old GetVariableOrNumber behavior.
  const char* def = this->GetDefinitionIfUnquoted(arg);
  if (!def && atoi(arg.c_str())) {
    def = arg.c_str();
  }
  return !cmSystemTools::IsOff(def);
}